

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t m_cmp_race(void *a,void *b)

{
  monster_race *pmVar1;
  monster_race *pmVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t i;
  wchar_t base_b;
  wchar_t base_a;
  wchar_t c;
  wchar_t gid;
  monster_race *r_b;
  monster_race *r_a;
  int b_val;
  int a_val;
  void *b_local;
  void *a_local;
  
  pmVar1 = r_info;
  wVar5 = *a;
  wVar6 = *b;
  wVar3 = default_item_id(wVar5);
  pmVar2 = r_info;
  wVar4 = default_item_id(wVar6);
  wVar5 = default_group_id(wVar5);
  wVar6 = default_group_id(wVar6);
  a_local._4_4_ = wVar5 - wVar6;
  if (a_local._4_4_ == L'\0') {
    if ((wVar5 < L'\0') || (n_monster_group <= wVar5)) {
      __assert_fail("gid >= 0 && gid < n_monster_group",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                    ,0x496,"int m_cmp_race(const void *, const void *)");
    }
    if (monster_group[wVar5].n_inc_bases != L'\0') {
      i = monster_group[wVar5].n_inc_bases;
      local_48 = monster_group[wVar5].n_inc_bases;
      for (local_4c = L'\0'; local_4c < monster_group[wVar5].n_inc_bases;
          local_4c = local_4c + L'\x01') {
        if (pmVar1[wVar3].base == monster_group[wVar5].inc_bases[local_4c]) {
          i = local_4c;
        }
        if (pmVar2[wVar4].base == monster_group[wVar5].inc_bases[local_4c]) {
          local_48 = local_4c;
        }
      }
      if (i - local_48 != L'\0') {
        return i - local_48;
      }
    }
    a_local._4_4_ = pmVar1[wVar3].level - pmVar2[wVar4].level;
    if (a_local._4_4_ == L'\0') {
      a_local._4_4_ = strcmp(pmVar1[wVar3].name,pmVar2[wVar4].name);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int m_cmp_race(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct monster_race *r_a = &r_info[default_item_id(a_val)];
	const struct monster_race *r_b = &r_info[default_item_id(b_val)];
	int gid = default_group_id(a_val);

	/* Group by */
	int c = gid - default_group_id(b_val);
	if (c)
		return c;

	/*
	 * If the group specifies monster bases, order those that are included
	 * by the base by those bases.  Those that aren't in any of the bases
	 * appear last.
	 */
	assert(gid >= 0 && gid < n_monster_group);
	if (monster_group[gid].n_inc_bases) {
		int base_a = monster_group[gid].n_inc_bases;
		int base_b = monster_group[gid].n_inc_bases;
		int i;

		for (i = 0; i < monster_group[gid].n_inc_bases; ++i) {
			if (r_a->base == monster_group[gid].inc_bases[i]) {
				base_a = i;
			}
			if (r_b->base == monster_group[gid].inc_bases[i]) {
				base_b = i;
			}
		}
		c = base_a - base_b;
		if (c) {
			return c;
		}
	}

	/*
	 * Within the same base or outside of a specified base, order by level
	 * and then by name.
	 */
	c = r_a->level - r_b->level;
	if (c)
		return c;

	return strcmp(r_a->name, r_b->name);
}